

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xpath_string * __thiscall
pugi::impl::anon_unknown_0::xpath_ast_node::eval_string_concat
          (xpath_string *__return_storage_ptr__,xpath_ast_node *this,xpath_context *c,
          xpath_stack *stack)

{
  size_t *psVar1;
  size_t *psVar2;
  size_t sVar3;
  char_t *begin;
  char *local_e8;
  char_t *bi;
  size_t j;
  char_t *ri;
  char_t *result;
  size_t i;
  size_t length;
  size_t local_b0;
  size_t local_a8;
  xpath_ast_node *local_a0;
  xpath_ast_node *n;
  size_t pos;
  size_t local_88;
  size_t local_80;
  undefined1 local_78 [8];
  xpath_stack swapped_stack;
  xpath_string *buffer;
  xpath_ast_node *nc;
  size_t count;
  xpath_allocator_capture ct;
  xpath_stack *stack_local;
  xpath_context *c_local;
  xpath_ast_node *this_local;
  
  ct._state._error = (bool *)stack;
  if (this->_type != '!') {
    __assert_fail("_type == ast_func_concat",
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/pugixml.cpp"
                  ,0x2a49,
                  "xpath_string pugi::impl::(anonymous namespace)::xpath_ast_node::eval_string_concat(const xpath_context &, const xpath_stack &)"
                 );
  }
  xpath_allocator_capture::xpath_allocator_capture((xpath_allocator_capture *)&count,stack->temp);
  nc = (xpath_ast_node *)0x1;
  for (buffer = (xpath_string *)this->_right; buffer != (xpath_string *)0x0;
      buffer = (xpath_string *)buffer[1]._buffer) {
    nc = (xpath_ast_node *)&nc->_rettype;
  }
  psVar1 = (size_t *)
           xpath_allocator::allocate(*(xpath_allocator **)(ct._state._error + 8),(long)nc * 0x18);
  if (psVar1 == (size_t *)0x0) {
    xpath_string::xpath_string(__return_storage_ptr__);
  }
  else {
    local_78 = *(undefined1 (*) [8])(ct._state._error + 8);
    swapped_stack.result = *(xpath_allocator **)ct._state._error;
    eval_string((xpath_string *)&pos,this->_left,c,(xpath_stack *)local_78);
    *psVar1 = pos;
    psVar1[1] = local_88;
    psVar1[2] = local_80;
    n = (xpath_ast_node *)0x1;
    for (local_a0 = this->_right; local_a0 != (xpath_ast_node *)0x0; local_a0 = local_a0->_next) {
      eval_string((xpath_string *)&length,local_a0,c,(xpath_stack *)local_78);
      psVar2 = psVar1 + (long)n * 3;
      *psVar2 = length;
      psVar2[1] = local_b0;
      psVar2[2] = local_a8;
      n = (xpath_ast_node *)&n->_rettype;
    }
    if (n != nc) {
      __assert_fail("pos == count",
                    "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/pugixml.cpp"
                    ,0x2a5c,
                    "xpath_string pugi::impl::(anonymous namespace)::xpath_ast_node::eval_string_concat(const xpath_context &, const xpath_stack &)"
                   );
    }
    i = 0;
    for (result = (char_t *)0x0; result < nc; result = result + 1) {
      sVar3 = xpath_string::length((xpath_string *)(psVar1 + (long)result * 3));
      i = sVar3 + i;
    }
    begin = (char_t *)xpath_allocator::allocate(*(xpath_allocator **)ct._state._error,i + 1);
    if (begin == (char_t *)0x0) {
      xpath_string::xpath_string(__return_storage_ptr__);
    }
    else {
      j = (size_t)begin;
      for (bi = (char_t *)0x0; bi < nc; bi = bi + 1) {
        local_e8 = xpath_string::c_str((xpath_string *)(psVar1 + (long)bi * 3));
        for (; *local_e8 != '\0'; local_e8 = local_e8 + 1) {
          *(char *)j = *local_e8;
          j = j + 1;
        }
      }
      *(undefined1 *)j = 0;
      xpath_string::from_heap_preallocated(__return_storage_ptr__,begin,(char_t *)j);
    }
  }
  swapped_stack.temp._0_4_ = 1;
  xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)&count);
  return __return_storage_ptr__;
}

Assistant:

xpath_string eval_string_concat(const xpath_context& c, const xpath_stack& stack)
		{
			assert(_type == ast_func_concat);

			xpath_allocator_capture ct(stack.temp);

			// count the string number
			size_t count = 1;
			for (xpath_ast_node* nc = _right; nc; nc = nc->_next) count++;

			// allocate a buffer for temporary string objects
			xpath_string* buffer = static_cast<xpath_string*>(stack.temp->allocate(count * sizeof(xpath_string)));
			if (!buffer) return xpath_string();

			// evaluate all strings to temporary stack
			xpath_stack swapped_stack = {stack.temp, stack.result};

			buffer[0] = _left->eval_string(c, swapped_stack);

			size_t pos = 1;
			for (xpath_ast_node* n = _right; n; n = n->_next, ++pos) buffer[pos] = n->eval_string(c, swapped_stack);
			assert(pos == count);

			// get total length
			size_t length = 0;
			for (size_t i = 0; i < count; ++i) length += buffer[i].length();

			// create final string
			char_t* result = static_cast<char_t*>(stack.result->allocate((length + 1) * sizeof(char_t)));
			if (!result) return xpath_string();

			char_t* ri = result;

			for (size_t j = 0; j < count; ++j)
				for (const char_t* bi = buffer[j].c_str(); *bi; ++bi)
					*ri++ = *bi;

			*ri = 0;

			return xpath_string::from_heap_preallocated(result, ri);
		}